

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Archiver_GL.cpp
# Opt level: O1

void __thiscall
Diligent::SerializedPipelineStateImpl::PatchShadersGL<Diligent::ComputePipelineStateCreateInfo>
          (SerializedPipelineStateImpl *this,ComputePipelineStateCreateInfo *CreateInfo)

{
  IShader *pIVar1;
  long lVar2;
  long lVar3;
  void *pvVar4;
  void *pvVar5;
  int iVar6;
  undefined4 extraout_var;
  char (*in_RCX) [60];
  char (*Args_1) [86];
  long lVar7;
  long *plVar8;
  bool bVar9;
  RefCntAutoPtr<Diligent::SerializedShaderImpl> pShaderImpl;
  vector<Diligent::(anonymous_namespace)::ShaderStageInfoGL,_std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>_>
  ShaderStages;
  string msg;
  RefCntAutoPtr<Diligent::SerializedShaderImpl> local_108;
  SerializedPipelineStateImpl *local_100;
  void *local_f8;
  void *pvStack_f0;
  long local_e8;
  undefined1 local_d8 [32];
  anon_union_8_2_8aa5a88c_for_ShaderCreateInfo_4 local_b8;
  char *local_b0;
  ShaderMacro *local_a8;
  Uint32 local_a0;
  undefined8 local_9c;
  undefined8 uStack_94;
  undefined8 local_8c;
  undefined4 local_84;
  SHADER_SOURCE_LANGUAGE local_80;
  SHADER_COMPILER local_7c;
  ShaderVersion local_78;
  ShaderVersion SStack_70;
  ShaderVersion local_68;
  ShaderVersion SStack_60;
  undefined8 local_58;
  char *pcStack_50;
  char *local_48;
  long local_40;
  void *local_38;
  
  local_f8 = (void *)0x0;
  pvStack_f0 = (void *)0x0;
  local_e8 = 0;
  local_100 = this;
  if ((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType != PIPELINE_TYPE_COMPUTE) {
    FormatString<char[26],char[39]>
              ((string *)local_d8,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CreateInfo.PSODesc.IsComputePipeline()",(char (*) [39])in_RCX);
    in_RCX = (char (*) [60])0x101;
    DebugAssertionFailed
              ((Char *)local_d8._0_8_,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x101);
    if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
      operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
    }
  }
  pvStack_f0 = local_f8;
  if ((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType != PIPELINE_TYPE_COMPUTE) {
    FormatString<char[26],char[57]>
              ((string *)local_d8,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CreateInfo.PSODesc.PipelineType == PIPELINE_TYPE_COMPUTE",
               (char (*) [57])in_RCX);
    in_RCX = (char (*) [60])0x105;
    DebugAssertionFailed
              ((Char *)local_d8._0_8_,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x105);
    if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
      operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
    }
  }
  if (CreateInfo->pCS == (IShader *)0x0) {
    FormatString<char[26],char[26]>
              ((string *)local_d8,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CreateInfo.pCS != nullptr",(char (*) [26])in_RCX);
    in_RCX = (char (*) [60])0x106;
    DebugAssertionFailed
              ((Char *)local_d8._0_8_,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x106);
    if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
      operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
    }
  }
  iVar6 = (*(CreateInfo->pCS->super_IDeviceObject).super_IObject._vptr_IObject[4])();
  if (*(int *)(CONCAT44(extraout_var,iVar6) + 8) != 0x20) {
    FormatString<char[26],char[60]>
              ((string *)local_d8,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"CreateInfo.pCS->GetDesc().ShaderType == SHADER_TYPE_COMPUTE",in_RCX);
    in_RCX = (char (*) [60])0x107;
    DebugAssertionFailed
              ((Char *)local_d8._0_8_,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x107);
    if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
      operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
    }
  }
  pIVar1 = CreateInfo->pCS;
  local_108.m_pObject = (SerializedShaderImpl *)0x0;
  if (pIVar1 != (IShader *)0x0) {
    (**(pIVar1->super_IDeviceObject).super_IObject._vptr_IObject)
              (pIVar1,SerializedShaderImpl::IID_InternalImpl,&local_108);
  }
  if (local_108.m_pObject == (SerializedShaderImpl *)0x0) {
    FormatString<char[40]>
              ((string *)local_d8,(char (*) [40])"Unexpected shader object implementation");
    in_RCX = (char (*) [60])0x10a;
    DebugAssertionFailed
              ((Char *)local_d8._0_8_,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x10a);
    if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
      operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
    }
  }
  PipelineStateUtils::WaitUntilShaderReadyIfRequested<Diligent::SerializedShaderImpl>
            (&local_108,true);
  std::
  vector<Diligent::(anonymous_namespace)::ShaderStageInfoGL,std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>>
  ::emplace_back<Diligent::RefCntAutoPtr<Diligent::SerializedShaderImpl>&>
            ((vector<Diligent::(anonymous_namespace)::ShaderStageInfoGL,std::allocator<Diligent::(anonymous_namespace)::ShaderStageInfoGL>>
              *)&local_f8,&local_108);
  pvVar5 = pvStack_f0;
  pvVar4 = local_f8;
  if (local_f8 == pvStack_f0) {
    FormatString<char[26],char[22]>
              ((string *)local_d8,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"!ShaderStages.empty()",(char (*) [22])in_RCX);
    DebugAssertionFailed
              ((Char *)local_d8._0_8_,"ExtractShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/../GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x10f);
    if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
      operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
    }
  }
  RefCntAutoPtr<Diligent::SerializedShaderImpl>::Release(&local_108);
  if ((local_100->m_Data).Shaders._M_elems[0].
      super__Vector_base<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo,_std::allocator<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (local_100->m_Data).Shaders._M_elems[0].
      super__Vector_base<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo,_std::allocator<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    FormatString<char[26],char[64]>
              ((string *)local_d8,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_Data.Shaders[static_cast<size_t>(DeviceType::OpenGL)].empty()",
               (char (*) [64])local_100);
    DebugAssertionFailed
              ((Char *)local_d8._0_8_,"PatchShadersGL",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/Archiver_GL.cpp"
               ,0x222);
    if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
      operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
    }
  }
  local_40 = (long)pvVar5 - (long)pvVar4 >> 4;
  local_38 = pvVar4;
  if (pvVar5 != pvVar4) {
    lVar7 = local_40 + (ulong)(local_40 == 0);
    plVar8 = (long *)((long)pvVar4 + 8);
    do {
      lVar2 = *plVar8;
      lVar3 = *(long *)(lVar2 + 200);
      local_d8._8_8_ = *(size_type *)(lVar2 + 0x20);
      bVar9 = *(char *)(lVar3 + 0x118) != '\0';
      local_d8._16_8_ = *(size_type *)(lVar3 + 0xf0);
      local_80 = *(SHADER_SOURCE_LANGUAGE *)(lVar2 + 0x70);
      if (bVar9) {
        local_80 = SHADER_SOURCE_LANGUAGE_GLSL;
      }
      local_b8 = *(anon_union_8_2_8aa5a88c_for_ShaderCreateInfo_4 *)(lVar3 + 0xf8);
      local_b0 = *(char **)(lVar2 + 0x40);
      if (bVar9) {
        local_b0 = "main";
      }
      local_d8._0_8_ = (Char *)0x0;
      local_d8._24_8_ = 0;
      local_a8 = (ShaderMacro *)0x0;
      local_a0 = 0;
      local_9c = *(undefined8 *)(lVar2 + 0x54);
      uStack_94 = *(undefined8 *)(lVar2 + 0x5c);
      local_8c = *(undefined8 *)(lVar2 + 100);
      local_84 = *(undefined4 *)(lVar2 + 0x6c);
      local_7c = SHADER_COMPILER_DEFAULT;
      local_78 = *(ShaderVersion *)(lVar2 + 0x78);
      SStack_70 = *(ShaderVersion *)(lVar2 + 0x80);
      local_68 = *(ShaderVersion *)(lVar2 + 0x88);
      SStack_60 = *(ShaderVersion *)(lVar2 + 0x90);
      local_58 = *(undefined8 *)(lVar2 + 0x98);
      pcStack_50 = *(char **)(lVar2 + 0xa0);
      local_48 = *(char **)(lVar2 + 0xa8);
      SerializeShaderCreateInfo(local_100,OpenGL,(ShaderCreateInfo *)local_d8);
      plVar8 = plVar8 + 2;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
  pvVar4 = local_38;
  Args_1 = (char (*) [86])
           (((long)(local_100->m_Data).Shaders._M_elems[0].
                   super__Vector_base<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo,_std::allocator<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(local_100->m_Data).Shaders._M_elems[0].
                   super__Vector_base<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo,_std::allocator<Diligent::SerializedPipelineStateImpl::Data::ShaderInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555);
  if ((long)Args_1 - local_40 != 0) {
    FormatString<char[26],char[86]>
              ((string *)local_d8,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "m_Data.Shaders[static_cast<size_t>(DeviceType::OpenGL)].size() == ShaderStages.size()"
               ,Args_1);
    DebugAssertionFailed
              ((Char *)local_d8._0_8_,"PatchShadersGL",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/Archiver_GL.cpp"
               ,0x22c);
    if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
      operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
    }
  }
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,local_e8 - (long)pvVar4);
  }
  return;
}

Assistant:

void SerializedPipelineStateImpl::PatchShadersGL(const CreateInfoType& CreateInfo) noexcept(false)
{
    std::vector<ShaderStageInfoGL> ShaderStages;
    SHADER_TYPE                    ActiveShaderStages    = SHADER_TYPE_UNKNOWN;
    constexpr bool                 WaitUntilShadersReady = true;
    PipelineStateUtils::ExtractShaders<SerializedShaderImpl>(CreateInfo, ShaderStages, WaitUntilShadersReady, ActiveShaderStages);

    VERIFY_EXPR(m_Data.Shaders[static_cast<size_t>(DeviceType::OpenGL)].empty());
    for (size_t i = 0; i < ShaderStages.size(); ++i)
    {
        const auto& Stage             = ShaderStages[i];
        const auto& CI                = Stage.pShader->GetCreateInfo();
        const auto* pCompiledShaderGL = Stage.pShader->GetShader<CompiledShaderGL>(DeviceObjectArchive::DeviceType::OpenGL);
        const auto  SerCI             = pCompiledShaderGL->GetSerializationCI(CI);

        SerializeShaderCreateInfo(DeviceType::OpenGL, SerCI);
    }
    VERIFY_EXPR(m_Data.Shaders[static_cast<size_t>(DeviceType::OpenGL)].size() == ShaderStages.size());
}